

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
* __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::derivatives_at
          (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           *__return_storage_ptr__,
          Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this,double u,double v,
          Index order)

{
  element_type *peVar1;
  shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> local_40;
  Index local_30;
  Index order_local;
  double v_local;
  double u_local;
  Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this_local;
  
  local_30 = order;
  order_local = (Index)v;
  v_local = u;
  u_local = (double)this;
  this_local = (Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *)
               __return_storage_ptr__;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::operator->
            ((Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_40);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_40);
  (*(peVar1->super_SurfaceBase<2L>)._vptr_SurfaceBase[7])
            (v_local,order_local,__return_storage_ptr__,peVar1,local_30);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double u, const double v,
        const Index order) const override
    {
        return m_surface_geometry->derivatives_at(u, v, order);
    }